

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O1

void __thiscall testing::internal::String::String(String *this,char *a_c_str)

{
  size_t __n;
  char *__dest;
  
  if (a_c_str == (char *)0x0) {
    this->c_str_ = (char *)0x0;
    this->length_ = 0;
  }
  else {
    __n = strlen(a_c_str);
    __dest = (char *)operator_new__(__n + 1);
    memcpy(__dest,a_c_str,__n);
    __dest[__n] = '\0';
    this->c_str_ = __dest;
    this->length_ = __n;
  }
  return;
}

Assistant:

String(const char* a_c_str) {  // NOLINT
    if (a_c_str == NULL) {
      c_str_ = NULL;
      length_ = 0;
    } else {
      ConstructNonNull(a_c_str, strlen(a_c_str));
    }
  }